

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_line(LINE_DATA *line)

{
  long *in_RDI;
  LINE_DATA *lptr;
  char *in_stack_fffffffffffffff0;
  long *plVar1;
  
  free_pstring(in_stack_fffffffffffffff0);
  plVar1 = in_RDI;
  if (in_RDI[1] != 0) {
    if (in_RDI[2] == 0) {
      *(long *)(*in_RDI + 0x20) = in_RDI[1];
    }
    else {
      *(long *)(in_RDI[2] + 8) = in_RDI[1];
      *(long *)(in_RDI[1] + 0x10) = in_RDI[2];
    }
  }
  for (; plVar1 != (long *)0x0; plVar1 = (long *)plVar1[1]) {
    *(int *)(plVar1 + 3) = (int)plVar1[3] + -1;
  }
  if (in_RDI != (long *)0x0) {
    operator_delete(in_RDI,0x30);
  }
  return;
}

Assistant:

void free_line(LINE_DATA *line)
{
	LINE_DATA *lptr;

	free_pstring(line->text);

	if (line->next)
	{
		if (line->prev)
		{
			line->prev->next = line->next;
			line->next->prev = line->prev;
		}
		else
		{
			line->speech->first_line = line->next;
		}
	}

	for (lptr = line; lptr; lptr = lptr->next)
	{
		lptr->number--;
	}

	delete line;
}